

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

chunk_conflict * mtntop_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  loc to_avoid;
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  chunk *c;
  loc lVar10;
  loc lVar11;
  feature *pfVar12;
  loc_conflict lVar13;
  loc_conflict lVar14;
  wchar_t *pwVar15;
  uint uVar16;
  wchar_t wVar17;
  int iVar18;
  loc grid;
  ulong uVar19;
  ulong unaff_R12;
  loc_conflict grid1;
  long lVar20;
  loc grid_00;
  ulong uVar21;
  wchar_t wVar22;
  int A;
  long lVar23;
  wchar_t wVar24;
  wchar_t wVar25;
  uint32_t local_4c;
  
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  if (L'\0' < c->height) {
    lVar23 = 0;
    lVar20 = 0;
    do {
      unaff_R12 = 0;
      if (L'\0' < c->width) {
        unaff_R12 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar23 + unaff_R12),FEAT_VOID);
          unaff_R12 = unaff_R12 + 1;
        } while ((long)unaff_R12 < (long)c->width);
      }
      lVar20 = lVar20 + 1;
      lVar23 = lVar23 + 0x100000000;
    } while (lVar20 < c->height);
  }
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,false,false);
  do {
    uVar3 = Rand_div(6);
    iVar4 = uVar3 + 4;
    uVar5 = Rand_div(5);
    wVar24 = c->height / 2;
    grid_00.x = c->width / 2;
    uVar21 = (ulong)(uint)grid_00.x;
    wVar22 = wVar24 - (uVar5 + 4);
    wVar17 = grid_00.x - iVar4;
    _Var1 = generate_starburst_room
                      (c,wVar22,wVar17,wVar24 + uVar5 + L'\x04',grid_00.x + L'\x04' + uVar3,false,
                       FEAT_ROAD,false);
  } while (!_Var1);
  grid_00.y = wVar24;
  square_set_feat((chunk_conflict *)c,grid_00,FEAT_GRANITE);
  square_mark((chunk_conflict *)c,grid_00);
  lVar20 = 0;
  do {
    lVar11 = ddgrid[lVar20];
    lVar10 = (loc)loc_sum((loc_conflict)grid_00,(loc_conflict)lVar11);
    square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
    lVar11 = (loc)loc_sum((loc_conflict)grid_00,(loc_conflict)lVar11);
    square_mark((chunk_conflict *)c,lVar11);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  wVar24 = wVar24 + uVar5 + 4;
  uVar5 = 0;
  if (wVar22 < wVar24) {
    uVar16 = grid_00.x - iVar4;
    uVar5 = 0;
    wVar25 = wVar22;
    do {
      if ((int)uVar16 < grid_00.x + iVar4) {
        unaff_R12 = (ulong)uVar16;
        iVar18 = uVar3 * 2 + 8;
        do {
          pfVar12 = square_feat((chunk_conflict *)c,(loc)(unaff_R12 | (ulong)(uint)wVar25 << 0x20));
          uVar5 = uVar5 + (pfVar12->fidx == FEAT_ROAD);
          unaff_R12 = (ulong)((int)unaff_R12 + 1);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      else {
        unaff_R12 = (ulong)uVar16;
      }
      wVar25 = wVar25 + L'\x01';
    } while (wVar25 != wVar24);
  }
  uVar6 = Rand_div(uVar5);
  uVar7 = Rand_div(2);
  if (uVar7 == 0) {
    wVar25 = rand_range(wVar22,wVar24);
    pfVar12 = square_feat((chunk_conflict *)c,
                          (loc)(unaff_R12 & 0xffffffff | (ulong)(uint)wVar25 << 0x20));
    if (pfVar12->fidx != FEAT_VOID) {
      uVar7 = Rand_div(2);
      iVar18 = 0;
      if (uVar3 + 5 != 0) {
        uVar16 = -(uint)(uVar7 != 0) | 1;
        do {
          uVar21 = (ulong)(uint)(grid_00.x + iVar18);
          lVar11.y = wVar25;
          lVar11.x = grid_00.x + iVar18;
          pfVar12 = square_feat((chunk_conflict *)c,lVar11);
          if (pfVar12->fidx == FEAT_VOID) goto LAB_0015d17d;
          iVar18 = iVar18 + uVar16;
        } while ((uVar3 + 5) * uVar16 != iVar18);
        uVar21 = (ulong)(uint)(iVar18 + grid_00.x);
      }
LAB_0015d17d:
      square_set_feat((chunk_conflict *)c,(loc)((ulong)(uint)wVar25 << 0x20 | uVar21),FEAT_MORE);
    }
  }
  if (wVar22 < wVar24) {
    do {
      iVar18 = uVar3 * 2 + 8;
      wVar25 = wVar17;
      if (wVar17 < grid_00.x + iVar4) {
        do {
          lVar10.y = wVar22;
          lVar10.x = wVar25;
          pfVar12 = square_feat((chunk_conflict *)c,lVar10);
          if (((pfVar12->fidx != FEAT_VOID) &&
              (pfVar12 = square_feat((chunk_conflict *)c,lVar10), pfVar12->fidx != FEAT_GRANITE)) &&
             (pfVar12 = square_feat((chunk_conflict *)c,lVar10), pfVar12->fidx != FEAT_MORE)) {
            pfVar12 = square_feat((chunk_conflict *)c,lVar10);
            if ((pfVar12->fidx == FEAT_ROAD) && (uVar5 = uVar5 - 1, uVar5 == uVar6)) {
              player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar10);
              square_mark((chunk_conflict *)c,lVar10);
            }
            else {
              uVar7 = Rand_div(5);
              if (uVar7 == 0) {
                pwVar15 = &FEAT_GRANITE;
              }
              else {
                uVar7 = Rand_div(8);
                if (uVar7 == 0) {
                  pwVar15 = &FEAT_PASS_RUBBLE;
                }
                else {
                  uVar7 = Rand_div(0x14);
                  if (uVar7 != 0) goto LAB_0015d2db;
                  pwVar15 = &FEAT_TREE2;
                }
              }
              square_set_feat((chunk_conflict *)c,lVar10,*pwVar15);
            }
          }
LAB_0015d2db:
          iVar18 = iVar18 + -1;
          wVar25 = wVar25 + L'\x01';
        } while (iVar18 != 0);
      }
      wVar22 = wVar22 + L'\x01';
    } while (wVar22 != wVar24);
  }
  local_4c = Rand_div(4);
  iVar4 = 0;
  do {
    uVar3 = Rand_div(6);
    A = uVar3 + 4;
    uVar5 = Rand_div(5);
    iVar18 = uVar5 + 4;
    iVar8 = rand_range(iVar18,(c->height - uVar5) + -5);
    iVar9 = rand_range(A,(c->width - uVar3) + -5);
    lVar13 = loc(-4 - uVar3,-4 - uVar5);
    grid1.y = iVar8;
    grid1.x = iVar9;
    lVar13 = loc_sum(grid1,lVar13);
    lVar14 = loc(A,iVar18);
    lVar14 = loc_sum(grid1,lVar14);
    _Var1 = check_clearing_space((chunk_conflict *)c,lVar13,lVar14);
    if (_Var1) {
      wVar24 = iVar8 - iVar18;
      wVar17 = iVar9 - A;
      wVar22 = iVar8 + iVar18;
      _Var1 = generate_starburst_room(c,wVar24,wVar17,wVar22,iVar9 + A,false,FEAT_ROAD,false);
      if (_Var1) {
        if (wVar24 < wVar22) {
          do {
            wVar25 = wVar17;
            iVar18 = uVar3 * 2 + 8;
            if (wVar17 < iVar9 + A) {
              do {
                grid.y = wVar24;
                grid.x = wVar25;
                pfVar12 = square_feat((chunk_conflict *)c,grid);
                if (pfVar12->fidx != FEAT_VOID) {
                  uVar5 = Rand_div(5);
                  pwVar15 = &FEAT_GRANITE;
                  if (uVar5 != 0) {
                    uVar5 = Rand_div(8);
                    pwVar15 = &FEAT_PASS_RUBBLE;
                    if (uVar5 != 0) {
                      uVar5 = Rand_div(0x14);
                      pwVar15 = &FEAT_TREE2;
                      if (uVar5 != 0) goto LAB_0015d4c6;
                    }
                  }
                  square_set_feat((chunk_conflict *)c,grid,*pwVar15);
                }
LAB_0015d4c6:
                iVar18 = iVar18 + -1;
                wVar25 = wVar25 + L'\x01';
              } while (iVar18 != 0);
            }
            wVar24 = wVar24 + L'\x01';
          } while (wVar24 != wVar22);
        }
        local_4c = local_4c - 1;
        if (local_4c == 0) break;
      }
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 10);
  if (L'\0' < c->height) {
    lVar20 = 0;
    uVar21 = 0;
    do {
      if (L'\0' < c->width) {
        uVar19 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar20 + uVar19));
          if (((uVar19 == 0 || uVar21 == 0) || (uVar21 == (uint)(c->height + L'\xffffffff'))) ||
             (uVar19 == (uint)(c->width + L'\xffffffff'))) {
            square_set_feat((chunk_conflict *)c,(loc)(lVar20 + uVar19),FEAT_PERM);
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)c->width);
      }
      uVar21 = uVar21 + 1;
      lVar20 = lVar20 + 0x100000000;
    } while ((long)uVar21 < (long)c->height);
  }
  wVar17 = c->depth;
  get_mon_num(wVar17,wVar17);
  if (L'\0' < wVar17) {
    iVar4 = wVar17 + L'\x01';
    do {
      to_avoid.x = (player->grid).x;
      to_avoid.y = (player->grid).y;
      pick_and_place_distant_monster(c,to_avoid,L'\n',true,c->depth);
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  iVar2 = Rand_normal((uint)z_info->both_item_av,3);
  alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar2,c->depth,'\x01');
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *mtntop_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	struct loc grid, top;
	int i, j, k;
	int plats, a, b;
	int spot, floors = 0;
	bool placed = false;

	/* Make the level */
	struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Start with void */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create void */
			square_set_feat(c, grid, FEAT_VOID);
		}
	}

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, false, false);

	/* Make the main mountaintop */
	while (!placed) {
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = c->height / 2;
		top.x = c->width / 2;
		placed = generate_starburst_room(c, top.y - b, top.x - a, top.y + b,
										 top.x + a, false, FEAT_ROAD, false);
	}

	/* Summit */
	square_set_feat(c, top, FEAT_GRANITE);
	square_mark(c, top);
	for (i = 0; i < 8; i++) {
		square_set_feat(c, loc_sum(top, ddgrid[i]), FEAT_GRANITE);
		square_mark(c, loc_sum(top, ddgrid[i]));
	}

	/* Count the floors */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors++;
			}
		}
	}

	/* Choose the player place */
	spot = randint0(floors);

	/* Can we get down? */
	if (one_in_(2)) {
		grid.y = rand_range(top.y - b, top.y + b);
		if (square_feat(c, grid)->fidx != FEAT_VOID) {
			i = one_in_(2) ? 1 : -1;
			for (grid.x = top.x; grid.x != (top.x + i * (a + 1)); grid.x += i) {
				if (square_feat(c, grid)->fidx == FEAT_VOID) break;
			}
			square_set_feat(c, grid, FEAT_MORE);
		}
	}

	/* Adjust the terrain, place the player */
	for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
		for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
			/* Only change generated stuff */
			if (square_feat(c, grid)->fidx == FEAT_VOID)
				continue;

			/* Leave rock */
			if (square_feat(c, grid)->fidx == FEAT_GRANITE)
				continue;

			/* Leave stair */
			if (square_feat(c, grid)->fidx == FEAT_MORE)
				continue;

			/* Place the player? */
			if (square_feat(c, grid)->fidx == FEAT_ROAD) {
				floors--;
				if (floors == spot) {
					player_place(c, p, grid);
					square_mark(c, grid);
					continue;
				}
			}

			/* Place some rock */
			if (one_in_(5)) {
				square_set_feat(c, grid, FEAT_GRANITE);
				continue;
			}

			/* rubble */
			if (one_in_(8)) {
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				continue;
			}

			/* and the odd tree */
			if (one_in_(20)) {
				square_set_feat(c, grid, FEAT_TREE2);
				continue;
			}
		}
	}

	/* Make a few "plateaux" */
	plats = randint0(4);

	/* Try fairly hard */
	for (j = 0; j < 10; j++) {
		/* Try for a plateau */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		top.y = rand_range(b, c->height - 1 - b);
		top.x = rand_range(a, c->width - 1 - a);
		if (!check_clearing_space(c, loc_sum(top, loc(-a, -b)),
				loc_sum(top, loc(a, b)))
				|| !generate_starburst_room(c, top.y - b,
				top.x - a, top.y + b, top.x + a, false,
				FEAT_ROAD, false)) continue;

		/* Success */
		plats--;

		/* Adjust the terrain a bit */
		for (grid.y = top.y - b; grid.y < top.y + b; grid.y++) {
			for (grid.x = top.x - a; grid.x < top.x + a; grid.x++) {
				/* Only change generated stuff */
				if (square_feat(c, grid)->fidx == FEAT_VOID)
					continue;

				/* Place some rock */
				if (one_in_(5)) {
					square_set_feat(c, grid, FEAT_GRANITE);
					continue;
				}

				/* rubble */
				if (one_in_(8)) {
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
					continue;
				}

				/* and the odd tree */
				if (one_in_(20)) {
					square_set_feat(c, grid, FEAT_TREE2);
					continue;
				}
			}
		}

		/* Done ? */
		if (!plats)
			break;
	}


	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);

			/* Paranoia - remake the dungeon walls */
			if ((grid.y == 0) || (grid.x == 0) ||
				(grid.y == c->height - 1) || (grid.x == c->width - 1)) {
				square_set_feat(c, grid, FEAT_PERM);
			}
		}
	}

	/* Basic "amount" */
	k = c->depth;

	/* Build the monster probability table. */
	(void) get_mon_num(c->depth, c->depth);

	/* Put some monsters in the dungeon */
	for (j = k; j > 0; j--) {
		(void) pick_and_place_distant_monster(c, player->grid, 10, true,
											  c->depth);
	}


	/* Put some objects in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(z_info->both_item_av, 3),
				 c->depth, ORIGIN_FLOOR);


	return c;
}